

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O1

void CVmObjGramProd::build_match_tree
               (CVmGramProdMatch *match,vm_val_t *toklist,vm_val_t *tokmatchlist,vm_val_t *retval,
               size_t *first_tok,size_t *last_tok)

{
  vm_prop_id_t vVar1;
  int iVar2;
  size_t sVar3;
  vm_datatype_t *pvVar4;
  vm_val_t *pvVar5;
  vm_obj_id_t vVar6;
  int iVar7;
  ulong uVar8;
  long *plVar9;
  size_t last_sub_tok;
  vm_val_t val;
  size_t first_sub_tok;
  ulong local_60;
  vm_val_t *local_58;
  vm_val_t local_50;
  vm_val_t local_40;
  
  pvVar5 = sp_;
  vVar6 = match->proc_obj_;
  if (vVar6 == 0) {
    iVar7 = vm_val_t::ll_length(toklist);
    iVar2 = (int)match->tok_pos_;
    if (iVar2 < iVar7) {
      local_50.val.obj = iVar2 + 1;
      local_50.typ = VM_INT;
      vm_val_t::ll_index(toklist,&local_40,&local_50);
      local_50.typ = VM_INT;
      local_50.val.obj = 1;
      vm_val_t::ll_index(&local_40,retval,&local_50);
      if (match->matched_star_ == 0) {
        CVmObjList::cons_set_element
                  ((CVmObjList *)
                   ((long)&G_obj_table_X.pages_[(tokmatchlist->val).obj >> 0xc]->ptr_ +
                   (ulong)(((tokmatchlist->val).obj & 0xfff) * 0x18)),match->tok_pos_,
                   &match->tok_match_result_);
      }
    }
    else {
      retval->typ = VM_NIL;
    }
    if (match->matched_star_ == 0) {
      sVar3 = match->tok_pos_;
      *last_tok = sVar3;
      *first_tok = sVar3;
    }
  }
  else {
    pvVar4 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar4 = VM_OBJ;
    (pvVar5->val).obj = vVar6;
    local_58 = retval;
    vVar6 = CVmObjTads::create_from_stack_intern((uchar **)0x0,1,0);
    pvVar5 = sp_;
    plVar9 = (long *)((long)&G_obj_table_X.pages_[vVar6 >> 0xc]->ptr_ +
                     (ulong)((vVar6 & 0xfff) * 0x18));
    pvVar4 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar4 = VM_OBJ;
    (pvVar5->val).obj = vVar6;
    *first_tok = match->tok_pos_ + 1;
    *last_tok = match->tok_pos_;
    if (match->sub_match_cnt_ != 0) {
      uVar8 = 0;
      do {
        build_match_tree(match->sub_match_list_[uVar8],toklist,tokmatchlist,&local_50,
                         (size_t *)&local_40,&local_60);
        if (uVar8 == 0) {
          *first_tok = local_40._0_8_;
LAB_002661a4:
          *last_tok = local_60;
        }
        else if ((ulong)local_40._0_8_ <= local_60) {
          if ((ulong)local_40._0_8_ < *first_tok) {
            *first_tok = local_40._0_8_;
          }
          if (*last_tok < local_60) goto LAB_002661a4;
        }
        vVar1 = match->sub_match_list_[uVar8]->target_prop_;
        if (vVar1 != 0) {
          (**(code **)(*plVar9 + 0x60))(plVar9,0,vVar6,vVar1,&local_50);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < match->sub_match_cnt_);
    }
    if ((G_predef_X.gramprod_first_tok != 0) && (G_predef_X.gramprod_last_tok != 0)) {
      local_50.val.obj = (int)*first_tok + 1;
      local_50.typ = VM_INT;
      (**(code **)(*plVar9 + 0x60))(plVar9,0,vVar6,G_predef_X.gramprod_first_tok,&local_50);
      local_50.val.obj = (int)*last_tok + 1;
      local_50.typ = VM_INT;
      (**(code **)(*plVar9 + 0x60))(plVar9,0,vVar6,G_predef_X.gramprod_last_tok,&local_50);
    }
    pvVar5 = local_58;
    if (G_predef_X.gramprod_token_list != 0) {
      (**(code **)(*plVar9 + 0x60))(plVar9,0,vVar6,G_predef_X.gramprod_token_list,toklist);
    }
    if (G_predef_X.gramprod_token_match_list != 0) {
      (**(code **)(*plVar9 + 0x60))
                (plVar9,0,vVar6,G_predef_X.gramprod_token_match_list,tokmatchlist);
    }
    sp_ = sp_ + -1;
    pvVar5->typ = VM_OBJ;
    (pvVar5->val).obj = vVar6;
  }
  return;
}

Assistant:

void CVmObjGramProd::build_match_tree(VMG_ const CVmGramProdMatch *match,
                                      const vm_val_t *toklist,
                                      const vm_val_t *tokmatchlist,
                                      vm_val_t *retval,
                                      size_t *first_tok, size_t *last_tok)
{
    /* check to see what kind of match we have */
    if (match->proc_obj_ != VM_INVALID_OBJ)
    {
        vm_obj_id_t obj_id;
        CVmObjTads *objp;
        size_t i;

        /* 
         *   Create the object to hold the current tree level.  The only
         *   constructor argument is the superclass, which is the match's
         *   processor object. 
         */
        G_stk->push()->set_obj(match->proc_obj_);
        obj_id = CVmObjTads::create_from_stack(vmg_ 0, 1);

        /* get a pointer to the new object */
        objp = (CVmObjTads *)vm_objp(vmg_ obj_id);

        /* push this object to protect it from gc for a moment */
        G_stk->push()->set_obj(obj_id);

        /* 
         *   Initialize the caller's first/last token indices to an invalid
         *   range, in case we have no subproductions.  A production with no
         *   tokens and no subproductions matches no tokens at all; we
         *   indicate this by using an invalid range, with the first token
         *   index higher than the last token index.  Note that it's still
         *   important that we accurately reflect the end of our range for a
         *   zero-token match, since our enclosing nodes will need our
         *   position to figure out where they go.  
         */
        *first_tok = match->tok_pos_ + 1;
        *last_tok = match->tok_pos_;

        /* build the sub-match entries */
        for (i = 0 ; i < match->sub_match_cnt_ ; ++i)
        {
            size_t first_sub_tok;
            size_t last_sub_tok;
            vm_val_t val;

            /* build this subtree */
            build_match_tree(vmg_ match->sub_match_list_[i],
                             toklist, tokmatchlist,
                             &val, &first_sub_tok, &last_sub_tok);

            /* 
             *   If this is the first subtree, use it as the tentative
             *   limits for our overall match so far; otherwise, expand our
             *   limits if they are outside our range so far.
             *   
             *   If the submatch doesn't include any tokens, it obviously
             *   has no effect on our range.  The submatch range will
             *   indicate that the first token index is greater than the
             *   last token index if the submatch includes no tokens.  
             */
            if (i == 0)
            {
                /* it's the first subtree - it's all we know as yet */
                *first_tok = first_sub_tok;
                *last_tok = last_sub_tok;
            }
            else if (first_sub_tok <= last_sub_tok)
            {
                /* check to see if it expands our current range */
                if (first_sub_tok < *first_tok)
                    *first_tok = first_sub_tok;
                if (last_sub_tok > *last_tok)
                    *last_tok = last_sub_tok;
            }

            /* 
             *   save the subtree with the current match object if there's a
             *   property in which to save it 
             */
            if (match->sub_match_list_[i]->target_prop_ != VM_INVALID_PROP)
            {
                /* 
                 *   Set the processor object property for the value.  Note
                 *   that we don't have to keep undo for this change, since
                 *   we just created the tree object ourselves, and we don't
                 *   create any undo savepoints - an object created after
                 *   the most recent undo savepoint doesn't need to keep
                 *   undo information, since the entire object will be
                 *   deleted if we undo to the savepoint. 
                 */
                objp->set_prop(vmg_ 0, obj_id,
                               match->sub_match_list_[i]->target_prop_,
                               &val);
            }
        }

        /* 
         *   if we have exported properties for recording the token index
         *   range, save them with the object 
         */
        if (G_predef->gramprod_first_tok != VM_INVALID_PROP
            && G_predef->gramprod_last_tok != VM_INVALID_PROP)
        {
            vm_val_t val;

            /* save the first token index */
            val.set_int((int)*first_tok + 1);
            objp->set_prop(vmg_ 0, obj_id,
                           G_predef->gramprod_first_tok, &val);

            /* save the last token index */
            val.set_int((int)*last_tok + 1);
            objp->set_prop(vmg_ 0, obj_id,
                           G_predef->gramprod_last_tok, &val);
        }

        /* 
         *   if we have the token list property exported, set it to the
         *   original token list reference 
         */
        if (G_predef->gramprod_token_list != VM_INVALID_PROP)
        {
            /* save the token list reference */
            objp->set_prop(vmg_ 0, obj_id,
                           G_predef->gramprod_token_list, toklist);
        }

        /* if we have the token match list property exported, set it */
        if (G_predef->gramprod_token_match_list != VM_INVALID_PROP)
        {
            /* save the token match list reference */
            objp->set_prop(vmg_ 0, obj_id,
                           G_predef->gramprod_token_match_list, tokmatchlist);
        }

        /* discard our gc protection */
        G_stk->discard();

        /* the return value is the object */
        retval->set_obj(obj_id);
    }
    else
    {
        /* get the token list */
        int lstcnt = toklist->ll_length(vmg0_);

        /* make sure the index is in range */
        if ((int)match->tok_pos_ < lstcnt)
        {
            vm_val_t ele_val;
            CVmObjList *match_lst;
            
            /* get the token from the list */
            toklist->ll_index(vmg_ &ele_val, match->tok_pos_ + 1);

            /* 
             *   the token is itself a list, whose first element is the
             *   token's value - retrieve the value 
             */
            ele_val.ll_index(vmg_ retval, 1);

            /* 
             *   Store the token match result in the result list.  If this is
             *   a '*' match, it doesn't have a result list contribution,
             *   because '*' doesn't actually match any tokens (it merely
             *   stops parsing). 
             */
            if (!match->matched_star_)
            {
                /* get the match list */
                match_lst = (CVmObjList *)vm_objp(vmg_ tokmatchlist->val.obj);

                /* 
                 *   set the element at this token position in the match list
                 *   to the token match result 
                 */
                match_lst->cons_set_element(
                    match->tok_pos_, &match->tok_match_result_);
            }
        }
        else
        {
            /* 
             *   the index is past the end of the list - this must be a
             *   '*' token that matched nothing (i.e., the token list was
             *   fully consumed before we reached the '*'), so just return
             *   nil for the match value 
             */
            retval->set_nil();
        }

        /* 
         *   We match one token, so it's the first and last index.  Note
         *   that if this is a '*' match, we don't match any tokens.  
         */
        if (!match->matched_star_)
            *first_tok = *last_tok = match->tok_pos_;
    }
}